

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int pbrt::ParameterTypeTraits<(pbrt::ParameterType)2>::Convert(double *v,FileLoc *loc)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  string ret;
  string local_40;
  int local_1c;
  
  dVar1 = *v;
  if (dVar1 <= 2147483647.0) {
    if (-2147483648.0 <= dVar1) {
      auVar2 = vcvtdq2pd_avx(ZEXT416((uint)(int)dVar1));
      if ((dVar1 == auVar2._0_8_) && (!NAN(dVar1) && !NAN(auVar2._0_8_))) goto LAB_00398fd3;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_40._M_string_length = 0;
      local_40.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<double_const&>
                (&local_40,"Floating-point value %f will be rounded to an integer",v);
      Warning(loc,local_40._M_dataplus._M_p);
    }
    else {
      local_1c = -0x80000000;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_40._M_string_length = 0;
      local_40.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<double_const&,int>
                (&local_40,"Numeric value %f too low to represent as an integer. Clamping to %d",v,
                 &local_1c);
      Warning(loc,local_40._M_dataplus._M_p);
    }
  }
  else {
    local_1c = 0x7fffffff;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<double_const&,int>
              (&local_40,"Numeric value %f too large to represent as an integer. Clamping to %d",v,
               &local_1c);
    Warning(loc,local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
LAB_00398fd3:
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *v;
  auVar2 = vminsd_avx(ZEXT816(0x41dfffffffc00000),auVar5);
  uVar3 = vcmpsd_avx512f(auVar5,ZEXT816(0xc1e0000000000000),1);
  bVar4 = (bool)((byte)uVar3 & 1);
  return (int)(double)((ulong)bVar4 * -0x3e20000000000000 + (ulong)!bVar4 * auVar2._0_8_);
}

Assistant:

static int Convert(const double *v, const FileLoc *loc) {
        if (*v > std::numeric_limits<int>::max())
            Warning(loc,
                    "Numeric value %f too large to represent as an integer. "
                    "Clamping to %d",
                    *v, std::numeric_limits<int>::max());
        else if (*v < std::numeric_limits<int>::lowest())
            Warning(loc,
                    "Numeric value %f too low to represent as an integer. "
                    "Clamping to %d",
                    *v, std::numeric_limits<int>::lowest());
        else if (double(int(*v)) != *v)
            Warning(loc, "Floating-point value %f will be rounded to an integer", *v);

        return int(Clamp(*v, std::numeric_limits<int>::lowest(),
                         std::numeric_limits<int>::max()));
    }